

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPServer.hpp
# Opt level: O3

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
webfront::http::Headers::getHeadersValues_abi_cxx11_
          (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Headers *this,string_view headerName)

{
  size_t *psVar1;
  pointer pHVar2;
  bool bVar3;
  _Node *p_Var4;
  pointer pHVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  string_view s1;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  pHVar5 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pHVar2 = (this->headers).
           super__Vector_base<webfront::http::Headers::Header,_std::allocator<webfront::http::Headers::Header>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pHVar5 != pHVar2) {
    __args = &pHVar5->value;
    do {
      s1._M_str = __args[-1]._M_dataplus._M_p;
      s1._M_len = __args[-1]._M_string_length;
      bVar3 = caseInsensitiveEqual(s1,headerName);
      if (bVar3) {
        p_Var4 = ::std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>
                           ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                            __return_storage_ptr__,__args);
        ::std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
        psVar1 = &(__return_storage_ptr__->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      pHVar5 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (pHVar5 != pHVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::list<std::string> getHeadersValues(std::string_view headerName) const {
        std::list<std::string> values{};
        for (auto& header : headers)
            if (caseInsensitiveEqual(header.name, headerName)) values.push_back(header.value);
        return values;
    }